

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

void cmdline_run_saved(Conf *conf)

{
  cmdline_saved_param_set *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = 0;
  do {
    pcVar1 = saves + lVar4;
    if (saves[lVar4].nsaved != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        cmdline_process_param
                  (*(char **)((long)&pcVar1->params->p + lVar3),
                   *(char **)((long)&pcVar1->params->value + lVar3),0,conf);
        safefree(*(void **)((long)&pcVar1->params->p + lVar3));
        safefree(*(void **)((long)&pcVar1->params->value + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar2 < saves[lVar4].nsaved);
    }
    saves[lVar4].nsaved = 0;
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  return;
}

Assistant:

void cmdline_run_saved(Conf *conf)
{
    for (size_t pri = 0; pri < NPRIORITIES; pri++) {
        for (size_t i = 0; i < saves[pri].nsaved; i++) {
            cmdline_process_param(saves[pri].params[i].p,
                                  saves[pri].params[i].value, 0, conf);
            sfree(saves[pri].params[i].p);
            sfree(saves[pri].params[i].value);
        }
        saves[pri].nsaved = 0;
    }
}